

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          int value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  FileDescriptor *file;
  EnumDescriptor *this_00;
  LogMessage *pLVar5;
  string *value_00;
  EnumValueDescriptor *this_01;
  LogFinisher local_75 [13];
  LogMessage local_68;
  EnumValueDescriptor *local_30;
  EnumValueDescriptor *value_desc;
  int value_local;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  value_desc._0_4_ = value;
  value_desc._4_4_ = index;
  _value_local = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_value_local,"SetRepeatedEnum","Field does not match message type."
              );
  }
  LVar2 = FieldDescriptor::label(_value_local);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_value_local,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(_value_local);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,_value_local,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  file = Descriptor::file(this->descriptor_);
  bVar1 = CreateUnknownEnumValues(file);
  if (!bVar1) {
    this_00 = FieldDescriptor::enum_type(_value_local);
    local_30 = EnumDescriptor::FindValueByNumber(this_00,(int)value_desc);
    if (local_30 == (EnumValueDescriptor *)0x0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x560);
      pLVar5 = LogMessage::operator<<
                         (&local_68,"SetRepeatedEnumValue accepts only valid integer values: ");
      pLVar5 = LogMessage::operator<<(pLVar5,"value ");
      pLVar5 = LogMessage::operator<<(pLVar5,(int)value_desc);
      pLVar5 = LogMessage::operator<<(pLVar5," unexpected for field ");
      value_00 = FieldDescriptor::full_name_abi_cxx11_(_value_local);
      pLVar5 = LogMessage::operator<<(pLVar5,value_00);
      LogFinisher::operator=(local_75,pLVar5);
      LogMessage::~LogMessage(&local_68);
      this_01 = FieldDescriptor::default_value_enum(_value_local);
      value_desc._0_4_ = EnumValueDescriptor::number(this_01);
    }
  }
  SetRepeatedEnumValueInternal
            (this,(Message *)field_local,_value_local,value_desc._4_4_,(int)value_desc);
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnumValue(
    Message* message,
    const FieldDescriptor* field, int index,
    int value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  if (!CreateUnknownEnumValues(descriptor_->file())) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == NULL) {
      GOOGLE_LOG(DFATAL) << "SetRepeatedEnumValue accepts only valid integer values: "
                  << "value " << value << " unexpected for field "
                  << field->full_name();
      // In production builds, DFATAL will not terminate the program, so we have
      // to do something reasonable: just set the default value.
      value = field->default_value_enum()->number();
    }
  }
  SetRepeatedEnumValueInternal(message, field, index, value);
}